

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::contains
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  TypeBase *pTVar5;
  bool bVar6;
  
  uVar1 = this->bucketCount;
  if (uVar1 != 0) {
    uVar3 = (ulong)((*key)->nameHash & uVar1 - 1);
    pTVar5 = this->data[uVar3];
    if (pTVar5 != (TypeBase *)0x0) {
      bVar2 = 1;
      uVar4 = 1;
      bVar6 = true;
      do {
        if ((pTVar5 == *key) || (bVar6 = uVar4 < uVar1, uVar4 == uVar1)) goto LAB_001788c0;
        uVar3 = (ulong)((int)uVar3 + uVar4 & uVar1 - 1);
        pTVar5 = this->data[uVar3];
        uVar4 = uVar4 + 1;
      } while (pTVar5 != (TypeBase *)0x0);
      bVar2 = 0;
LAB_001788c0:
      return (bool)(bVar6 & bVar2);
    }
  }
  return false;
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}